

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O0

vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
* spvtools::CFA<spvtools::opt::BasicBlock>::CalculateDominators
            (vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
             *__return_storage_ptr__,
            vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
            *postorder,get_blocks_func *predecessor_func)

{
  size_t sVar1;
  anon_class_16_2_0ffbb6a2_for__M_pred __pred;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  this;
  __node_base_ptr p_Var2;
  bool bVar3;
  size_type sVar4;
  const_reference ppBVar5;
  mapped_type *pmVar6;
  reference ppBVar7;
  reference ppBVar8;
  size_type sVar9;
  reference ppVar10;
  type *ptVar11;
  type *ppBVar12;
  iterator __first;
  iterator __last;
  value_type local_170;
  type local_168;
  pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*> local_160;
  __node_base_ptr local_150;
  size_t dominator;
  pair<const_spvtools::opt::BasicBlock_*const,_block_detail> idom_1;
  iterator __end0_1;
  iterator __begin0_1;
  unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
  *__range2;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *local_110;
  size_t finger2;
  size_t finger1;
  BasicBlock *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range4;
  size_t idom_idx;
  BasicBlock *idom;
  unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
  *local_c8;
  __node_base_ptr local_c0;
  BasicBlock **local_b8;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  local_b0;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  local_a8;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  res;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *predecessors;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
  b;
  bool changed;
  ulong local_68;
  size_t i;
  unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
  idoms;
  size_t undefined_dom;
  get_blocks_func *predecessor_func_local;
  vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
  *postorder_local;
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  *out;
  
  idoms._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
       ::size(postorder);
  std::
  unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
  ::unordered_map((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                   *)&i);
  for (local_68 = 0;
      sVar4 = std::
              vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
              ::size(postorder), p_Var2 = idoms._M_h._M_single_bucket, local_68 < sVar4;
      local_68 = local_68 + 1) {
    ppBVar5 = std::
              vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
              ::operator[](postorder,local_68);
    pmVar6 = std::
             unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
             ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                           *)&i,ppBVar5);
    pmVar6->dominator = (size_t)p_Var2;
    pmVar6->postorder_index = local_68;
  }
  ppBVar5 = std::
            vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
            ::back(postorder);
  pmVar6 = std::
           unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
           ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                         *)&i,ppBVar5);
  sVar1 = pmVar6->postorder_index;
  ppBVar5 = std::
            vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
            ::back(postorder);
  pmVar6 = std::
           unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
           ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                         *)&i,ppBVar5);
  pmVar6->dominator = sVar1;
  b.current._M_current._7_1_ = 1;
  while ((b.current._M_current._7_1_ & 1) != 0) {
    b.current._M_current._7_1_ = 0;
    std::
    vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>::
    rbegin((vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
            *)&stack0xffffffffffffff70);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
    ::operator+((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                 *)&stack0xffffffffffffff78,(difference_type)&stack0xffffffffffffff70);
    while( true ) {
      std::
      vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
      ::rend((vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
              *)&predecessors);
      bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                               *)&stack0xffffffffffffff78,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                               *)&predecessors);
      if (!bVar3) break;
      ppBVar7 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                             *)&stack0xffffffffffffff78);
      res._M_current =
           (BasicBlock **)
           std::
           function<const_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_*(const_spvtools::opt::BasicBlock_*)>
           ::operator()(predecessor_func,*ppBVar7);
      local_b0._M_current =
           (BasicBlock **)
           std::
           begin<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
                     ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)res._M_current);
      local_b8 = (BasicBlock **)
                 std::
                 end<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
                           (res._M_current);
      local_c8 = (unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                  *)&i;
      local_c0 = idoms._M_h._M_single_bucket;
      __pred.undefined_dom = (size_t)idoms._M_h._M_single_bucket;
      __pred.idoms = local_c8;
      local_a8 = std::
                 find_if<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock*const*,std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>,spvtools::CFA<spvtools::opt::BasicBlock>::CalculateDominators(std::vector<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>const&,std::function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>)::_lambda(spvtools::opt::BasicBlock*)_1_>
                           (local_b0,(__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                      )local_b8,__pred);
      idom = (BasicBlock *)
             std::
             end<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
                       ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)res._M_current);
      bVar3 = __gnu_cxx::operator==
                        (&local_a8,
                         (__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                          *)&idom);
      if (!bVar3) {
        ppBVar8 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                  ::operator*(&local_a8);
        idom_idx = (size_t)*ppBVar8;
        pmVar6 = std::
                 unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                 ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                               *)&i,(key_type *)&idom_idx);
        this = res;
        __range4 = (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)pmVar6->postorder_index;
        __end0 = std::
                 vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
                 begin(res._M_current);
        p = (BasicBlock *)
            std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
            end((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *
                )this._M_current);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end0,(__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                           *)&p), bVar3) {
          ppBVar8 = __gnu_cxx::
                    __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                    ::operator*(&__end0);
          finger1 = (size_t)*ppBVar8;
          if (((idom_idx != finger1) &&
              (sVar9 = std::
                       unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                       ::count((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                                *)&i,(key_type *)&finger1), sVar9 != 0)) &&
             (pmVar6 = std::
                       unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                       ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                                     *)&i,(key_type *)&finger1),
             (__node_base_ptr)pmVar6->dominator != idoms._M_h._M_single_bucket)) {
            pmVar6 = std::
                     unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                     ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                                   *)&i,(key_type *)&finger1);
            finger2 = pmVar6->postorder_index;
            local_110 = __range4;
            while ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)finger2 != local_110) {
              while (finger2 < local_110) {
                ppBVar5 = std::
                          vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
                          ::operator[](postorder,finger2);
                pmVar6 = std::
                         unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                         ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                                       *)&i,ppBVar5);
                finger2 = pmVar6->dominator;
              }
              while (local_110 < finger2) {
                ppBVar5 = std::
                          vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
                          ::operator[](postorder,(size_type)local_110);
                pmVar6 = std::
                         unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                         ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                                       *)&i,ppBVar5);
                local_110 = (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                             *)pmVar6->dominator;
              }
            }
            __range4 = (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)finger2;
          }
          __gnu_cxx::
          __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
          ::operator++(&__end0);
        }
        ppBVar7 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                               *)&stack0xffffffffffffff78);
        pmVar6 = std::
                 unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                 ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                               *)&i,ppBVar7);
        if ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
            pmVar6->dominator != __range4) {
          ppBVar7 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                                 *)&stack0xffffffffffffff78);
          pmVar6 = std::
                   unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                   ::operator[]((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                                 *)&i,ppBVar7);
          pmVar6->dominator = (size_t)__range4;
          b.current._M_current._7_1_ = 1;
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::opt::BasicBlock_*const_*,_std::vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>_>
                    *)&stack0xffffffffffffff78);
    }
  }
  std::
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  ::vector(__return_storage_ptr__);
  __end0_1 = std::
             unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
             ::begin((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                      *)&i);
  idom_1.second.postorder_index =
       (size_t)std::
               unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
               ::end((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                      *)&i);
  while (bVar3 = std::__detail::operator!=
                           (&__end0_1.
                             super__Node_iterator_base<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>,_false>
                            ,(_Node_iterator_base<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>,_false>
                              *)&idom_1.second.postorder_index), bVar3) {
    ppVar10 = std::__detail::
              _Node_iterator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>,_false,_false>
              ::operator*(&__end0_1);
    dominator = (size_t)ppVar10->first;
    idom_1.first = (BasicBlock *)(ppVar10->second).dominator;
    idom_1.second.dominator = (ppVar10->second).postorder_index;
    ptVar11 = std::
              get<1ul,spvtools::opt::BasicBlock_const*const,spvtools::CFA<spvtools::opt::BasicBlock>::CalculateDominators(std::vector<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>const&,std::function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>)::block_detail>
                        ((pair<const_spvtools::opt::BasicBlock_*const,_block_detail> *)&dominator);
    local_150 = (__node_base_ptr)ptVar11->dominator;
    if (local_150 == idoms._M_h._M_single_bucket) {
      ptVar11 = std::
                get<1ul,spvtools::opt::BasicBlock_const*const,spvtools::CFA<spvtools::opt::BasicBlock>::CalculateDominators(std::vector<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>const&,std::function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>)::block_detail>
                          ((pair<const_spvtools::opt::BasicBlock_*const,_block_detail> *)&dominator)
      ;
      local_150 = (__node_base_ptr)ptVar11->postorder_index;
    }
    ppBVar12 = std::
               get<0ul,spvtools::opt::BasicBlock_const*const,spvtools::CFA<spvtools::opt::BasicBlock>::CalculateDominators(std::vector<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>const&,std::function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>)::block_detail>
                         ((pair<const_spvtools::opt::BasicBlock_*const,_block_detail> *)&dominator);
    local_168 = *ppBVar12;
    ppBVar5 = std::
              vector<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
              ::operator[](postorder,(size_type)local_150);
    local_170 = *ppBVar5;
    std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>::
    pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_true>
              (&local_160,&local_168,&local_170);
    std::
    vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ::push_back(__return_storage_ptr__,&local_160);
    std::__detail::
    _Node_iterator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>,_false,_false>::
    operator++(&__end0_1);
  }
  __first = std::
            vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
            ::begin(__return_storage_ptr__);
  __last = std::
           vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
           ::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*>*,std::vector<std::pair<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*>,std::allocator<std::pair<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*>>>>,spvtools::CFA<spvtools::opt::BasicBlock>::CalculateDominators(std::vector<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>const&,std::function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>)::_lambda(std::pair<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*>const&,std::pair<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*>const&)_1_>
            ((__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>_>
              )__last._M_current,
             (unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
              *)&i);
  std::
  unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
  ::~unordered_map((unordered_map<const_spvtools::opt::BasicBlock_*,_block_detail,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_block_detail>_>_>
                    *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<BB*, BB*>> CFA<BB>::CalculateDominators(
    const std::vector<cbb_ptr>& postorder, get_blocks_func predecessor_func) {
  struct block_detail {
    size_t dominator;  ///< The index of blocks's dominator in post order array
    size_t postorder_index;  ///< The index of the block in the post order array
  };
  const size_t undefined_dom = postorder.size();

  std::unordered_map<cbb_ptr, block_detail> idoms;
  for (size_t i = 0; i < postorder.size(); i++) {
    idoms[postorder[i]] = {undefined_dom, i};
  }
  idoms[postorder.back()].dominator = idoms[postorder.back()].postorder_index;

  bool changed = true;
  while (changed) {
    changed = false;
    for (auto b = postorder.rbegin() + 1; b != postorder.rend(); ++b) {
      const std::vector<BB*>& predecessors = *predecessor_func(*b);
      // Find the first processed/reachable predecessor that is reachable
      // in the forward traversal.
      auto res = std::find_if(std::begin(predecessors), std::end(predecessors),
                              [&idoms, undefined_dom](BB* pred) {
                                return idoms.count(pred) &&
                                       idoms[pred].dominator != undefined_dom;
                              });
      if (res == end(predecessors)) continue;
      const BB* idom = *res;
      size_t idom_idx = idoms[idom].postorder_index;

      // all other predecessors
      for (const auto* p : predecessors) {
        if (idom == p) continue;
        // Only consider nodes reachable in the forward traversal.
        // Otherwise the intersection doesn't make sense and will never
        // terminate.
        if (!idoms.count(p)) continue;
        if (idoms[p].dominator != undefined_dom) {
          size_t finger1 = idoms[p].postorder_index;
          size_t finger2 = idom_idx;
          while (finger1 != finger2) {
            while (finger1 < finger2) {
              finger1 = idoms[postorder[finger1]].dominator;
            }
            while (finger2 < finger1) {
              finger2 = idoms[postorder[finger2]].dominator;
            }
          }
          idom_idx = finger1;
        }
      }
      if (idoms[*b].dominator != idom_idx) {
        idoms[*b].dominator = idom_idx;
        changed = true;
      }
    }
  }

  std::vector<std::pair<bb_ptr, bb_ptr>> out;
  for (auto idom : idoms) {
    // At this point if there is no dominator for the node, just make it
    // reflexive.
    auto dominator = std::get<1>(idom).dominator;
    if (dominator == undefined_dom) {
      dominator = std::get<1>(idom).postorder_index;
    }
    // NOTE: performing a const cast for convenient usage with
    // UpdateImmediateDominators
    out.push_back({const_cast<BB*>(std::get<0>(idom)),
                   const_cast<BB*>(postorder[dominator])});
  }

  // Sort by postorder index to generate a deterministic ordering of edges.
  std::sort(
      out.begin(), out.end(),
      [&idoms](const std::pair<bb_ptr, bb_ptr>& lhs,
               const std::pair<bb_ptr, bb_ptr>& rhs) {
        assert(lhs.first);
        assert(lhs.second);
        assert(rhs.first);
        assert(rhs.second);
        auto lhs_indices = std::make_pair(idoms[lhs.first].postorder_index,
                                          idoms[lhs.second].postorder_index);
        auto rhs_indices = std::make_pair(idoms[rhs.first].postorder_index,
                                          idoms[rhs.second].postorder_index);
        return lhs_indices < rhs_indices;
      });
  return out;
}